

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easylogging++.cc
# Opt level: O1

void __thiscall
el::Configuration::Configuration
          (Configuration *this,Level level,ConfigurationType configurationType,string *value)

{
  pointer pcVar1;
  
  (this->super_Loggable)._vptr_Loggable = (_func_int **)&PTR__Configuration_00135160;
  this->m_level = level;
  this->m_configurationType = configurationType;
  (this->m_value)._M_dataplus._M_p = (pointer)&(this->m_value).field_2;
  pcVar1 = (value->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->m_value,pcVar1,pcVar1 + value->_M_string_length);
  return;
}

Assistant:

Configuration::Configuration(Level level, ConfigurationType configurationType, const std::string& value) :
  m_level(level),
  m_configurationType(configurationType),
  m_value(value) {
}